

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

int calculate_boost_bits(int frame_count,int boost,int64_t total_group_bits)

{
  int iVar1;
  int64_t iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = 0;
  if (0 < total_group_bits && boost != 0) {
    if (frame_count < 1) {
      iVar2 = 0x7fffffff;
      if (total_group_bits < 0x7fffffff) {
        iVar2 = total_group_bits;
      }
      return (int)iVar2;
    }
    uVar3 = frame_count * 100 + boost;
    if (0x3ff < boost) {
      uVar4 = (uint)boost >> 10;
      boost = (uint)boost / uVar4;
      uVar3 = uVar3 / uVar4;
    }
    iVar1 = (int)((boost * total_group_bits) / (long)(int)uVar3);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int calculate_boost_bits(int frame_count, int boost,
                                int64_t total_group_bits) {
  int allocation_chunks;

  // return 0 for invalid inputs (could arise e.g. through rounding errors)
  if (!boost || (total_group_bits <= 0)) return 0;

  if (frame_count <= 0) return (int)(AOMMIN(total_group_bits, INT_MAX));

  allocation_chunks = (frame_count * 100) + boost;

  // Prevent overflow.
  if (boost > 1023) {
    int divisor = boost >> 10;
    boost /= divisor;
    allocation_chunks /= divisor;
  }

  // Calculate the number of extra bits for use in the boosted frame or frames.
  return AOMMAX((int)(((int64_t)boost * total_group_bits) / allocation_chunks),
                0);
}